

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_list_equal(lyd_node *node1,lyd_node *node2,int with_defaults)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  ly_ctx *plVar2;
  byte bVar3;
  int iVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  lys_module *plVar9;
  lyd_node *second;
  lyd_node **pplVar10;
  lyd_node *plVar11;
  uint diff_ctx;
  char *pcVar12;
  char *pcVar13;
  lyd_node **pplVar14;
  uint uVar15;
  
  ctx = node2->schema->module->ctx;
  plVar2 = node1->schema->module->ctx;
  diff_ctx = (uint)(plVar2 != ctx);
  LVar1 = node2->schema->nodetype;
  if (LVar1 == LYS_LIST) {
    bVar3 = node1->schema->padding[2];
    pplVar10 = &node1->child;
    if (bVar3 == 0) {
      plVar11 = *pplVar10;
      plVar8 = node2->child;
      if (*pplVar10 == (lyd_node *)0x0 && node2->child == (lyd_node *)0x0) {
        return 1;
      }
      while ((second = plVar8, plVar11 != (lyd_node *)0x0 && (second != (lyd_node *)0x0))) {
        if (plVar11->hash != second->hash) {
          return 0;
        }
        if (plVar2 == ctx) {
          plVar5 = plVar11->schema;
        }
        else {
          plVar5 = lyd_get_schema_inctx(plVar11,ctx);
          if (plVar5 == (lys_node *)0x0) {
            plVar9 = plVar11->schema->module;
            if ((plVar9->field_0x40 & 1) != 0) {
              plVar9 = (lys_module *)plVar9->data;
            }
            pcVar12 = plVar9->name;
            pcVar13 = plVar11->schema->name;
            goto LAB_0015ea08;
          }
        }
        if (plVar5 != second->schema) {
          return 0;
        }
        LVar1 = second->schema->nodetype;
        if (LVar1 == LYS_LIST) {
          iVar4 = lyd_list_has_keys(plVar11);
          if ((iVar4 != 0) || (iVar4 = lyd_list_has_keys(second), iVar4 != 0)) goto LAB_0015e946;
LAB_0015e953:
          plVar8 = (lyd_node *)0x0;
LAB_0015e955:
          plVar7 = plVar11->next;
        }
        else {
          if ((LVar1 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            if (((LVar1 & LYS_ANYDATA) != LYS_UNKNOWN) &&
               (iVar4 = lyd_anydata_equal(plVar11,second), iVar4 == 0)) {
              return 0;
            }
          }
          else {
            iVar4 = lyd_leaf_val_equal(plVar11,second,diff_ctx);
            if (iVar4 == 0) {
              if (with_defaults == 0) {
                return 0;
              }
              if (((second->field_0x9 ^ plVar11->field_0x9) & 1) == 0) {
                return 0;
              }
            }
          }
LAB_0015e946:
          if ((second->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
          goto LAB_0015e953;
          plVar7 = plVar11->child;
          plVar8 = second->child;
          if (plVar7 == (lyd_node *)0x0) goto LAB_0015e955;
        }
        if (plVar8 == (lyd_node *)0x0) {
          plVar8 = second->next;
        }
        while ((plVar7 == (lyd_node *)0x0 && (plVar11 = plVar11->parent, plVar11 != node1))) {
          plVar7 = plVar11->next;
        }
        while ((plVar11 = plVar7, plVar8 == (lyd_node *)0x0 &&
               (second = second->parent, second != node2))) {
          plVar8 = second->next;
        }
      }
      if (plVar11 == (lyd_node *)0x0 && second == (lyd_node *)0x0) {
        return 1;
      }
    }
    else {
      pplVar14 = &node2->child;
      plVar5 = (lys_node *)0x0;
      for (uVar15 = 0; uVar15 < bVar3; uVar15 = uVar15 + 1) {
        plVar11 = *pplVar14;
        plVar8 = *pplVar10;
        if (plVar8 != (lyd_node *)0x0 && plVar2 != ctx) {
          if (plVar5 == (lys_node *)0x0) {
            plVar5 = lyd_get_schema_inctx(plVar8,ctx);
            if (plVar5 == (lys_node *)0x0) {
              plVar9 = plVar8->schema->module;
              if ((plVar9->field_0x40 & 1) != 0) {
                plVar9 = (lys_module *)plVar9->data;
              }
              pcVar12 = plVar9->name;
              pcVar13 = plVar8->schema->name;
LAB_0015ea08:
              ly_log(ctx,LY_LLERR,LY_EINVAL,
                     "Target context does not contain a required schema node (%s:%s).",pcVar12,
                     pcVar13);
              return -1;
            }
          }
          else {
            plVar5 = plVar5->next;
          }
        }
        if ((plVar8 == (lyd_node *)0x0) || (plVar11 == (lyd_node *)0x0)) break;
        plVar6 = plVar5;
        if (plVar5 == (lys_node *)0x0) {
          plVar6 = plVar8->schema;
        }
        if ((plVar6 != plVar11->schema) ||
           (iVar4 = lyd_leaf_val_equal(plVar8,plVar11,diff_ctx), iVar4 == 0)) break;
        pplVar10 = &plVar8->next;
        pplVar14 = &plVar11->next;
        bVar3 = node1->schema->padding[2];
      }
      if (node1->schema->padding[2] == uVar15) {
        return 1;
      }
    }
  }
  else {
    if (LVar1 != LYS_LEAFLIST) {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
             ,0x113);
      return -1;
    }
    iVar4 = lyd_leaf_val_equal(node1,node2,diff_ctx);
    if (iVar4 != 0) {
      if (with_defaults == 0) {
        return 1;
      }
      if (((node2->field_0x9 ^ node1->field_0x9) & 1) == 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
lyd_list_equal(struct lyd_node *node1, struct lyd_node *node2, int with_defaults)
{
    int i, diff_ctx;
    struct lyd_node *elem1, *next1, *elem2, *next2;
    struct lys_node *elem1_sch;
    struct ly_ctx *ctx = node2->schema->module->ctx;

    diff_ctx = (node1->schema->module->ctx != node2->schema->module->ctx);

    switch (node2->schema->nodetype) {
    case LYS_LEAFLIST:
        if (lyd_leaf_val_equal(node1, node2, diff_ctx) && (!with_defaults || (node1->dflt == node2->dflt))) {
            return 1;
        }
        break;
    case LYS_LIST:
        if (((struct lys_node_list *)node1->schema)->keys_size) {
            /* lists with keys, their equivalence isb ased on their keys */
            elem1 = node1->child;
            elem2 = node2->child;
            elem1_sch = NULL;
            /* the exact data order is guaranteed */
            for (i = 0; i < ((struct lys_node_list *)node1->schema)->keys_size; ++i) {
                if (diff_ctx && elem1) {
                    /* we have different contexts */
                    if (!elem1_sch) {
                        elem1_sch = lyd_get_schema_inctx(elem1, ctx);
                        if (!elem1_sch) {
                            LOGERR(ctx, LY_EINVAL, "Target context does not contain a required schema node (%s:%s).",
                                   lyd_node_module(elem1)->name, elem1->schema->name);
                            return -1;
                        }
                    } else {
                        /* just move to the next schema node */
                        elem1_sch = elem1_sch->next;
                    }
                }
                if (!elem1 || !elem2 || ((elem1_sch ? elem1_sch : elem1->schema) != elem2->schema)
                        || !lyd_leaf_val_equal(elem1, elem2, diff_ctx)) {
                    break;
                }
                elem1 = elem1->next;
                elem2 = elem2->next;
            }
            if (i == ((struct lys_node_list *)node1->schema)->keys_size) {
                return 1;
            }
        } else {
            /* lists wihtout keys, their equivalence is based on values of all the children (both dierct and indirect) */
            if (!node1->child && !node2->child) {
                /* no children, nothing to compare */
                return 1;
            }

            /* status lists without keys, we need to compare all the children :( */

            /* LY_TREE_DFS_BEGIN for 2 data trees */
            elem1 = next1 = node1->child;
            elem2 = next2 = node2->child;
            while (elem1 && elem2) {
                /* node comparison */
#ifdef LY_ENABLED_CACHE
                if (elem1->hash != elem2->hash) {
                    break;
                }
#endif
                if (diff_ctx) {
                    elem1_sch = lyd_get_schema_inctx(elem1, ctx);
                    if (!elem1_sch) {
                        LOGERR(ctx, LY_EINVAL, "Target context does not contain a required schema node (%s:%s).",
                               lyd_node_module(elem1)->name, elem1->schema->name);
                        return -1;
                    }
                } else {
                    elem1_sch = elem1->schema;
                }
                if (elem1_sch != elem2->schema) {
                    break;
                }
                if (elem2->schema->nodetype == LYS_LIST) {
                    if (!lyd_list_has_keys(elem1) && !lyd_list_has_keys(elem2)) {
                        /* we encountered lists without keys (but have some defined in schema), ignore them for comparison */
                        next1 = NULL;
                        next2 = NULL;
                        goto next_sibling;
                    }
                    /* we will compare all the children of this list instance, not just keys */
                } else if (elem2->schema->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
                    if (!lyd_leaf_val_equal(elem1, elem2, diff_ctx) && (!with_defaults || (elem1->dflt == elem2->dflt))) {
                        break;
                    }
                } else if (elem2->schema->nodetype & LYS_ANYDATA) {
                    if (!lyd_anydata_equal(elem1, elem2)) {
                        break;
                    }
                }

                /* LY_TREE_DFS_END for 2 data trees */
                if (elem2->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    next1 = NULL;
                    next2 = NULL;
                } else {
                    next1 = elem1->child;
                    next2 = elem2->child;
                }

next_sibling:
                if (!next1) {
                    next1 = elem1->next;
                }
                if (!next2) {
                    next2 = elem2->next;
                }

                while (!next1) {
                    elem1 = elem1->parent;
                    if (elem1 == node1) {
                        break;
                    }
                    next1 = elem1->next;
                }
                while (!next2) {
                    elem2 = elem2->parent;
                    if (elem2 == node2) {
                        break;
                    }
                    next2 = elem2->next;
                }

                elem1 = next1;
                elem2 = next2;
            }

            if (!elem1 && !elem2) {
                /* all children were successfully compared */
                return 1;
            }
        }
        break;
    default:
        LOGINT(ctx);
        return -1;
    }

    return 0;
}